

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O3

void __thiscall Types::Types(Types *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->elements)._M_t._M_impl.super__Rb_tree_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->elements2)._M_h._M_buckets = &(this->elements2)._M_h._M_single_bucket;
  (this->elements2)._M_h._M_bucket_count = 1;
  (this->elements2)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elements2)._M_h._M_element_count = 0;
  (this->elements2)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->elements2)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->elements2)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Types::Types() {
//	counter = 0;

}